

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O2

void __thiscall RecordType::RecordType(RecordType *this,RecordFieldList *record_fields)

{
  pointer ppRVar1;
  
  Type::Type(&this->super_Type,RECORD);
  (this->super_Type).super_DataDepElement._vptr_DataDepElement =
       (_func_int **)&PTR__RecordType_001415f8;
  (this->super_Type).value_var_ = (ID *)0x0;
  if (record_fields != (RecordFieldList *)0x0) {
    for (ppRVar1 = (record_fields->super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppRVar1 !=
        (record_fields->super__Vector_base<RecordField_*,_std::allocator<RecordField_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppRVar1 = ppRVar1 + 1) {
      Type::AddField(&this->super_Type,&(*ppRVar1)->super_Field);
    }
  }
  this->record_fields_ = record_fields;
  this->parsing_dataptr_var_field_ = (Field *)0x0;
  return;
}

Assistant:

RecordType::RecordType(RecordFieldList* record_fields) : Type(RECORD)
	{
	// Here we assume that the type is a standalone type.
	value_var_ = nullptr;

	// Put all fields in fields_
	foreach (i, RecordFieldList, record_fields)
		AddField(*i);

	// Put RecordField's in record_fields_
	record_fields_ = record_fields;

	parsing_dataptr_var_field_ = nullptr;
	}